

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void CTPNCodeBodyBase::unref_label_cb(void *param_1,CTcSymbol *sym)

{
  tc_symtype_t tVar1;
  CTPNStmLabel *pCVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  CTcSymLabelBase *in_RSI;
  ulong flags;
  CTcSymLabel *lbl;
  
  tVar1 = CTcSymbolBase::get_type((CTcSymbolBase *)in_RSI);
  if ((tVar1 == TC_SYM_LABEL) &&
     (pCVar2 = CTcSymLabelBase::get_stm(in_RSI), pCVar2 != (CTPNStmLabel *)0x0)) {
    pCVar2 = CTcSymLabelBase::get_stm(in_RSI);
    uVar3 = CTPNStmLabelBase::get_explicit_control_flow_flags(&pCVar2->super_CTPNStmLabelBase);
    if ((uVar3 & 0x70) == 0) {
      pCVar2 = CTcSymLabelBase::get_stm(in_RSI);
      sVar4 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x25d81a);
      pcVar5 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x25d828);
      CTPNStmBase::log_warning((CTPNStmBase *)pCVar2,0x2d0c,sVar4 & 0xffffffff,pcVar5);
    }
  }
  return;
}

Assistant:

void CTPNCodeBodyBase::unref_label_cb(void *, CTcSymbol *sym)
{
    /* if it's a label, check it out */
    if (sym->get_type() == TC_SYM_LABEL)
    {
        CTcSymLabel *lbl = (CTcSymLabel *)sym;

        /* 
         *   get its underlying statement, and make sure it has a
         *   control-flow flag for goto, continue, or break 
         */
        if (lbl->get_stm() != 0)
        {
            ulong flags;

            /* 
             *   get the explicit control flow flags for this statement --
             *   these flags indicate the use of the label in a goto,
             *   break, or continue statement 
             */
            flags = lbl->get_stm()->get_explicit_control_flow_flags();

            /* 
             *   if the flags aren't set for at least one of the explicit
             *   label uses, the label is unreferenced 
             */
            if ((flags & (TCPRS_FLOW_GOTO | TCPRS_FLOW_BREAK
                          | TCPRS_FLOW_CONT)) == 0)
                lbl->get_stm()->log_warning(TCERR_UNREFERENCED_LABEL,
                                            (int)lbl->get_sym_len(),
                                            lbl->get_sym());
        }
    }
}